

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cc
# Opt level: O0

int CBB_add_utf8(CBB *cbb,uint32_t u)

{
  int iVar1;
  byte value;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  uint32_t u_local;
  CBB *cbb_local;
  
  iVar1 = is_valid_code_point(u);
  if (iVar1 == 0) {
    cbb_local._4_4_ = 0;
  }
  else {
    value = (byte)u;
    if (u < 0x80) {
      cbb_local._4_4_ = CBB_add_u8(cbb,value);
    }
    else if (u < 0x800) {
      iVar1 = CBB_add_u8(cbb,(byte)(u >> 6) | 0xc0);
      local_1d = false;
      if (iVar1 != 0) {
        iVar1 = CBB_add_u8(cbb,value & 0x3f | 0x80);
        local_1d = iVar1 != 0;
      }
      cbb_local._4_4_ = (uint)local_1d;
    }
    else if (u < 0x10000) {
      iVar1 = CBB_add_u8(cbb,(byte)(u >> 0xc) | 0xe0);
      local_1e = false;
      if (iVar1 != 0) {
        iVar1 = CBB_add_u8(cbb,(byte)(u >> 6) & 0x3f | 0x80);
        local_1e = false;
        if (iVar1 != 0) {
          iVar1 = CBB_add_u8(cbb,value & 0x3f | 0x80);
          local_1e = iVar1 != 0;
        }
      }
      cbb_local._4_4_ = (uint)local_1e;
    }
    else if (u < 0x110000) {
      iVar1 = CBB_add_u8(cbb,(byte)(u >> 0x12) | 0xf0);
      local_1f = false;
      if (iVar1 != 0) {
        iVar1 = CBB_add_u8(cbb,(byte)(u >> 0xc) & 0x3f | 0x80);
        local_1f = false;
        if (iVar1 != 0) {
          iVar1 = CBB_add_u8(cbb,(byte)(u >> 6) & 0x3f | 0x80);
          local_1f = false;
          if (iVar1 != 0) {
            iVar1 = CBB_add_u8(cbb,value & 0x3f | 0x80);
            local_1f = iVar1 != 0;
          }
        }
      }
      cbb_local._4_4_ = (uint)local_1f;
    }
    else {
      cbb_local._4_4_ = 0;
    }
  }
  return cbb_local._4_4_;
}

Assistant:

int CBB_add_utf8(CBB *cbb, uint32_t u) {
  if (!is_valid_code_point(u)) {
    return 0;
  }
  if (u <= 0x7f) {
    return CBB_add_u8(cbb, (uint8_t)u);
  }
  if (u <= 0x7ff) {
    return CBB_add_u8(cbb, TOP_BITS(2) | (u >> 6)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  if (u <= 0xffff) {
    return CBB_add_u8(cbb, TOP_BITS(3) | (u >> 12)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 6) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  if (u <= 0x10ffff) {
    return CBB_add_u8(cbb, TOP_BITS(4) | (u >> 18)) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 12) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | ((u >> 6) & BOTTOM_BITS(6))) &&
           CBB_add_u8(cbb, TOP_BITS(1) | (u & BOTTOM_BITS(6)));
  }
  return 0;
}